

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockBuilderAddNode(ImGuiID id,ImGuiDockNodeFlags flags)

{
  ImGuiID id_00;
  ImVec2 local_28;
  ImGuiDockNode *local_20;
  ImGuiDockNode *node;
  ImGuiContext *ctx;
  ImGuiDockNodeFlags flags_local;
  ImGuiID id_local;
  
  node = (ImGuiDockNode *)GImGui;
  ctx._0_4_ = flags;
  ctx._4_4_ = id;
  if (id != 0) {
    DockBuilderRemoveNode(id);
  }
  id_00 = ctx._4_4_;
  local_20 = (ImGuiDockNode *)0x0;
  if (((uint)ctx & 0x400) == 0) {
    local_20 = DockContextAddNode((ImGuiContext *)node,ctx._4_4_);
    ImGuiDockNode::SetLocalFlags(local_20,(uint)ctx);
  }
  else {
    ImVec2::ImVec2(&local_28,0.0,0.0);
    DockSpace(id_00,&local_28,(uint)ctx & 0xfffffbff | 1,(ImGuiWindowClass *)0x0);
    local_20 = DockContextFindNodeByID((ImGuiContext *)node,ctx._4_4_);
  }
  local_20->LastFrameAlive = *(int *)&node[0x51].ParentNode;
  return local_20->ID;
}

Assistant:

ImGuiID ImGui::DockBuilderAddNode(ImGuiID id, ImGuiDockNodeFlags flags)
{
    ImGuiContext* ctx = GImGui;

    if (id != 0)
        DockBuilderRemoveNode(id);

    ImGuiDockNode* node = NULL;
    if (flags & ImGuiDockNodeFlags_DockSpace)
    {
        DockSpace(id, ImVec2(0, 0), (flags & ~ImGuiDockNodeFlags_DockSpace) | ImGuiDockNodeFlags_KeepAliveOnly);
        node = DockContextFindNodeByID(ctx, id);
    }
    else
    {
        node = DockContextAddNode(ctx, id);
        node->SetLocalFlags(flags);
    }
    node->LastFrameAlive = ctx->FrameCount;   // Set this otherwise BeginDocked will undock during the same frame.
    return node->ID;
}